

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_full_gau(char *fn)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  uint32 *veclen;
  vector_t ****var;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0xd0,"Reading %s\n",fn);
  iVar1 = s3gau_read_full(fn,&var,&n_mgau,&n_feat,&n_density,&veclen);
  if (iVar1 == 0) {
    printf("param %u %u %u (full)\n",(ulong)n_mgau,(ulong)n_feat,(ulong)n_density);
    for (uVar5 = 0; uVar5 < n_mgau; uVar5 = uVar5 + 1) {
      printf("mgau %u\n",uVar5 & 0xffffffff);
      for (uVar3 = 0; uVar3 < n_feat; uVar3 = uVar3 + 1) {
        printf("feat %u\n",uVar3 & 0xffffffff);
        for (uVar6 = 0; uVar6 < n_density; uVar6 = uVar6 + 1) {
          printf("density %4u (%ux%u)\n",uVar6 & 0xffffffff,(ulong)veclen[uVar3]);
          for (uVar7 = 0; uVar2 = (ulong)veclen[uVar3], uVar7 < uVar2; uVar7 = uVar7 + 1) {
            for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
              printf(e_fmt,(double)var[uVar5][uVar3][uVar6][uVar7][uVar4]);
              uVar2 = (ulong)veclen[uVar3];
            }
            putchar(10);
          }
        }
      }
    }
    ckd_free(veclen);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_full_gau(const char *fn)
{
    vector_t ****var;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 *veclen;
    uint32 n_density;
    uint32 i, j, k, l, m;

    E_INFO("Reading %s\n",  fn);
    
    if (s3gau_read_full(fn,
			&var,
			&n_mgau,
			&n_feat,
			&n_density,
			&veclen) != S3_SUCCESS)
	return S3_ERROR;

    printf("param %u %u %u (full)\n", n_mgau, n_feat, n_density);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feat %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %4u (%ux%u)\n", k, veclen[j], veclen[j]);
		for (l = 0; l < veclen[j]; l++) {
		    for (m = 0; m < veclen[j]; m++) {
			printf(e_fmt, var[i][j][k][l][m]);
		    }
		printf("\n");
		}
	    }
	}
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}